

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approx_top_k.cpp
# Opt level: O2

void duckdb::ApproxTopKOperation::Combine<duckdb::ApproxTopKState,duckdb::ApproxTopKOperation>
               (ApproxTopKState *aggr_source,ApproxTopKState *aggr_target,
               AggregateInputData *aggr_input)

{
  ApproxTopKString *__k;
  pointer puVar1;
  ApproxTopKValue *pAVar2;
  pointer prVar3;
  pointer prVar4;
  pointer prVar5;
  pointer puVar6;
  pointer puVar7;
  pointer puVar8;
  InternalApproxTopKState *pIVar9;
  InternalApproxTopKState *this;
  const_iterator cVar10;
  iterator iVar11;
  NotImplementedException *this_00;
  idx_t iVar12;
  idx_t increment;
  long lVar13;
  reference_wrapper<duckdb::ApproxTopKValue> *source_entry;
  pointer prVar14;
  idx_t target_idx;
  ulong uVar15;
  bool bVar16;
  allocator local_69;
  InternalApproxTopKState *local_68;
  idx_t local_60;
  AggregateInputData *local_58;
  string local_50;
  
  if (aggr_source->state != (InternalApproxTopKState *)0x0) {
    local_58 = aggr_input;
    pIVar9 = ApproxTopKState::GetState(aggr_source);
    this = ApproxTopKState::GetState(aggr_target);
    prVar14 = (pIVar9->values).
              super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((pIVar9->values).
        super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
        ._M_impl.super__Vector_impl_data._M_start != prVar14) {
      iVar12 = (prVar14[-1]._M_data)->count;
      prVar14 = (this->values).
                super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((this->values).
          super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
          .
          super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
          ._M_impl.super__Vector_impl_data._M_start == prVar14) {
        InternalApproxTopKState::Initialize(this,pIVar9->k);
        local_60 = 0;
      }
      else {
        if (pIVar9->k != this->k) {
          this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_50,
                     "Approx Top K - cannot combine approx_top_K with different k values. K values must be the same for all entries within the same group"
                     ,&local_69);
          NotImplementedException::NotImplementedException(this_00,&local_50);
          __cxa_throw(this_00,&NotImplementedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        local_60 = (prVar14[-1]._M_data)->count;
      }
      local_68 = pIVar9;
      for (uVar15 = 0;
          prVar14 = (this->values).
                    super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                    .
                    super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          uVar15 < (ulong)((long)(this->values).
                                 super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                                 .
                                 super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)prVar14 >> 3);
          uVar15 = uVar15 + 1) {
        pAVar2 = prVar14[uVar15]._M_data;
        cVar10 = ::std::
                 _Hashtable<duckdb::ApproxTopKString,_std::pair<const_duckdb::ApproxTopKString,_std::reference_wrapper<duckdb::ApproxTopKValue>_>,_std::allocator<std::pair<const_duckdb::ApproxTopKString,_std::reference_wrapper<duckdb::ApproxTopKValue>_>_>,_std::__detail::_Select1st,_duckdb::ApproxTopKEquality,_duckdb::ApproxTopKHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(pIVar9->lookup_map)._M_h,&pAVar2->str_val);
        increment = iVar12;
        if (cVar10.
            super__Node_iterator_base<std::pair<const_duckdb::ApproxTopKString,_std::reference_wrapper<duckdb::ApproxTopKValue>_>,_true>
            ._M_cur != (__node_type *)0x0) {
          increment = **(idx_t **)
                        ((long)cVar10.
                               super__Node_iterator_base<std::pair<const_duckdb::ApproxTopKString,_std::reference_wrapper<duckdb::ApproxTopKValue>_>,_true>
                               ._M_cur + 0x20);
        }
        if (increment != 0) {
          InternalApproxTopKState::IncrementCount(this,pAVar2,increment);
        }
      }
      prVar3 = (local_68->values).
               super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (prVar14 = (local_68->values).
                     super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                     .
                     super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; prVar14 != prVar3;
          prVar14 = prVar14 + 1) {
        pAVar2 = prVar14->_M_data;
        __k = &pAVar2->str_val;
        iVar11 = ::std::
                 _Hashtable<duckdb::ApproxTopKString,_std::pair<const_duckdb::ApproxTopKString,_std::reference_wrapper<duckdb::ApproxTopKValue>_>,_std::allocator<std::pair<const_duckdb::ApproxTopKString,_std::reference_wrapper<duckdb::ApproxTopKValue>_>_>,_std::__detail::_Select1st,_duckdb::ApproxTopKEquality,_duckdb::ApproxTopKHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(this->lookup_map)._M_h,__k);
        if (iVar11.
            super__Node_iterator_base<std::pair<const_duckdb::ApproxTopKString,_std::reference_wrapper<duckdb::ApproxTopKValue>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          iVar12 = pAVar2->count + local_60;
          prVar4 = (this->values).
                   super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                   .
                   super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          prVar5 = (this->values).
                   super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                   .
                   super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          lVar13 = (long)prVar5 - (long)prVar4;
          if (this->capacity <= (ulong)(lVar13 >> 3)) {
            if (prVar4 == prVar5) {
              uVar15 = 0;
            }
            else {
              uVar15 = **(ulong **)((long)prVar4 + lVar13 + -8);
            }
            bVar16 = iVar12 < uVar15;
            iVar12 = iVar12 - uVar15;
            if (bVar16 || iVar12 == 0) goto LAB_00b9aed0;
          }
          InternalApproxTopKState::InsertOrReplaceEntry(this,__k,local_58,iVar12);
        }
LAB_00b9aed0:
      }
      puVar6 = (local_68->filter).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar7 = (local_68->filter).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar8 = (this->filter).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar13 = 0; (long)puVar7 - (long)puVar6 >> 3 != lVar13; lVar13 = lVar13 + 1) {
        puVar1 = puVar8 + lVar13;
        *puVar1 = *puVar1 + puVar6[lVar13];
      }
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &aggr_source, STATE &aggr_target, AggregateInputData &aggr_input) {
		if (!aggr_source.state) {
			// source state is empty
			return;
		}
		auto &source = aggr_source.GetState();
		auto &target = aggr_target.GetState();
		if (source.values.empty()) {
			// source is empty
			return;
		}
		source.Verify();
		auto min_source = source.values.back().get().count;
		idx_t min_target;
		if (target.values.empty()) {
			min_target = 0;
			target.Initialize(source.k);
		} else {
			if (source.k != target.k) {
				throw NotImplementedException("Approx Top K - cannot combine approx_top_K with different k values. "
				                              "K values must be the same for all entries within the same group");
			}
			min_target = target.values.back().get().count;
		}
		// for all entries in target
		// check if they are tracked in source
		//     if they do - add the tracked count
		//     if they do not - add the minimum count
		for (idx_t target_idx = 0; target_idx < target.values.size(); target_idx++) {
			auto &val = target.values[target_idx].get();
			auto source_entry = source.lookup_map.find(val.str_val);
			idx_t increment = min_source;
			if (source_entry != source.lookup_map.end()) {
				increment = source_entry->second.get().count;
			}
			if (increment == 0) {
				continue;
			}
			target.IncrementCount(val, increment);
		}
		// now for each entry in source, if it is not tracked by the target, at the target minimum
		for (auto &source_entry : source.values) {
			auto &source_val = source_entry.get();
			auto target_entry = target.lookup_map.find(source_val.str_val);
			if (target_entry != target.lookup_map.end()) {
				// already tracked - no need to add anything
				continue;
			}
			auto new_count = source_val.count + min_target;
			idx_t increment;
			if (target.values.size() >= target.capacity) {
				idx_t current_min = target.values.empty() ? 0 : target.values.back().get().count;
				D_ASSERT(target.values.size() == target.capacity);
				// target already has capacity values
				// check if we should insert this entry
				if (new_count <= current_min) {
					// if we do not we can skip this entry
					continue;
				}
				increment = new_count - current_min;
			} else {
				// target does not have capacity entries yet
				// just add this entry with the full count
				increment = new_count;
			}
			target.InsertOrReplaceEntry(source_val.str_val, aggr_input, increment);
		}
		// copy over the filter
		D_ASSERT(source.filter.size() == target.filter.size());
		for (idx_t filter_idx = 0; filter_idx < source.filter.size(); filter_idx++) {
			target.filter[filter_idx] += source.filter[filter_idx];
		}
		target.Verify();
	}